

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeCOP3Mem(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  int32_t iVar1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint Reg_00;
  uint Reg_01;
  uint Base;
  uint Reg;
  int Offset;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  iVar1 = SignExtend32(Insn & 0xffff,0x10);
  RegNo = fieldFromInstruction(Insn,0x10,5);
  RegNo_00 = fieldFromInstruction(Insn,0x15,5);
  Reg_00 = getReg(Decoder,3,RegNo);
  Reg_01 = getReg(Decoder,8,RegNo_00);
  MCOperand_CreateReg0(Inst,Reg_00);
  MCOperand_CreateReg0(Inst,Reg_01);
  MCOperand_CreateImm0(Inst,(long)iVar1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeCOP3Mem(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Reg = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Reg = getReg(Decoder, Mips_COP3RegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}